

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_Parameters_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/Parameters.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Int64Parameter>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::Int64Parameter> *)
                   _Int64Parameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DoubleParameter>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::DoubleParameter> *)
                   _DoubleParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::StringParameter>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::StringParameter> *)
                   _StringParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BoolParameter>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::BoolParameter> *)
                   _BoolParameter_default_instance_);
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _Int64Parameter_default_instance_.DefaultConstruct();
  _DoubleParameter_default_instance_.DefaultConstruct();
  _StringParameter_default_instance_.DefaultConstruct();
  _BoolParameter_default_instance_.DefaultConstruct();
}